

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<unsigned_char,unsigned_char,unsigned_char,duckdb::ExclusiveBetweenOperator,true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  SelectionVector *pSVar4;
  data_ptr_t pdVar5;
  SelectionVector *pSVar6;
  data_ptr_t pdVar7;
  SelectionVector *pSVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  sel_t *psVar12;
  sel_t *psVar13;
  sel_t *psVar14;
  sel_t *psVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  
  pSVar4 = adata->sel;
  pdVar5 = adata->data;
  pSVar6 = bdata->sel;
  pdVar7 = bdata->data;
  pSVar8 = cdata->sel;
  pdVar9 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar22 = 0;
      }
      else {
        psVar10 = sel->sel_vector;
        psVar11 = pSVar4->sel_vector;
        psVar12 = pSVar6->sel_vector;
        psVar13 = pSVar8->sel_vector;
        psVar14 = false_sel->sel_vector;
        lVar22 = 0;
        uVar20 = 0;
        do {
          uVar21 = uVar20;
          if (psVar10 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar10[uVar20];
          }
          uVar17 = uVar20;
          if (psVar11 != (sel_t *)0x0) {
            uVar17 = (ulong)psVar11[uVar20];
          }
          uVar19 = uVar20;
          if (psVar12 != (sel_t *)0x0) {
            uVar19 = (ulong)psVar12[uVar20];
          }
          uVar18 = uVar20;
          if (psVar13 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar13[uVar20];
          }
          bVar1 = pdVar5[uVar17];
          bVar2 = pdVar7[uVar19];
          bVar3 = pdVar9[uVar18];
          psVar14[lVar22] = (sel_t)uVar21;
          lVar22 = lVar22 + (ulong)(bVar3 <= bVar1 || bVar1 <= bVar2);
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
      return count - lVar22;
    }
    if (count != 0) {
      psVar10 = sel->sel_vector;
      psVar11 = pSVar4->sel_vector;
      psVar12 = pSVar6->sel_vector;
      psVar13 = pSVar8->sel_vector;
      psVar14 = true_sel->sel_vector;
      iVar16 = 0;
      uVar20 = 0;
      do {
        uVar21 = uVar20;
        if (psVar10 != (sel_t *)0x0) {
          uVar21 = (ulong)psVar10[uVar20];
        }
        uVar17 = uVar20;
        if (psVar11 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar11[uVar20];
        }
        uVar19 = uVar20;
        if (psVar12 != (sel_t *)0x0) {
          uVar19 = (ulong)psVar12[uVar20];
        }
        uVar18 = uVar20;
        if (psVar13 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar13[uVar20];
        }
        bVar1 = pdVar5[uVar17];
        bVar2 = pdVar7[uVar19];
        bVar3 = pdVar9[uVar18];
        psVar14[iVar16] = (sel_t)uVar21;
        iVar16 = iVar16 + (bVar1 < bVar3 && bVar2 < bVar1);
        uVar20 = uVar20 + 1;
      } while (count != uVar20);
      return iVar16;
    }
  }
  else if (count != 0) {
    psVar10 = sel->sel_vector;
    psVar11 = pSVar4->sel_vector;
    psVar12 = pSVar6->sel_vector;
    psVar13 = pSVar8->sel_vector;
    psVar14 = true_sel->sel_vector;
    psVar15 = false_sel->sel_vector;
    iVar16 = 0;
    lVar22 = 0;
    uVar20 = 0;
    do {
      uVar21 = uVar20;
      if (psVar10 != (sel_t *)0x0) {
        uVar21 = (ulong)psVar10[uVar20];
      }
      uVar17 = uVar20;
      if (psVar11 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar11[uVar20];
      }
      uVar19 = uVar20;
      if (psVar12 != (sel_t *)0x0) {
        uVar19 = (ulong)psVar12[uVar20];
      }
      uVar18 = uVar20;
      if (psVar13 != (sel_t *)0x0) {
        uVar18 = (ulong)psVar13[uVar20];
      }
      bVar1 = pdVar5[uVar17];
      bVar2 = pdVar7[uVar19];
      bVar3 = pdVar9[uVar18];
      psVar14[iVar16] = (sel_t)uVar21;
      iVar16 = iVar16 + (bVar1 < bVar3 && bVar2 < bVar1);
      psVar15[lVar22] = (sel_t)uVar21;
      lVar22 = lVar22 + (ulong)(bVar3 <= bVar1 || bVar1 <= bVar2);
      uVar20 = uVar20 + 1;
    } while (count != uVar20);
    return iVar16;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}